

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::InnerErrorResponse::InnerErrorResponse(InnerErrorResponse *this)

{
  allocator local_25 [20];
  allocator local_11;
  InnerErrorResponse *local_10;
  InnerErrorResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::InnerErrorResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::InnerErrorResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::InnerErrorResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__InnerErrorResponse_01b3a2c8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  this->code_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->type_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->message_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  CollectFieldName();
  return;
}

Assistant:

InnerErrorResponse() {
    CollectFieldName();
  }